

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O3

string * __thiscall CFG::toDOT_abi_cxx11_(string *__return_storage_ptr__,CFG *this)

{
  Type TVar1;
  CfgNode *node;
  CfgNode *node_00;
  Data *pDVar2;
  _List_node_base *p_Var3;
  char cVar4;
  string *psVar5;
  ostream *poVar6;
  _List_node_base *p_Var7;
  _Base_ptr p_Var8;
  long lVar9;
  _Self __tmp;
  char *pcVar10;
  set<CfgNode::Edge,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_> succs;
  list<Instruction_*,_std::allocator<Instruction_*>_> instrs;
  list<CfgNode_*,_std::allocator<CfgNode_*>_> nodes;
  stringstream ss;
  int local_254;
  _Rb_tree<CfgNode::Edge,_CfgNode::Edge,_std::_Identity<CfgNode::Edge>,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_>
  local_248;
  _List_node_base local_218;
  string *local_200;
  _List_node_base *local_1f8;
  string local_1f0;
  _List_node_base local_1d0;
  stringstream local_1b8 [16];
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"digraph \"0x",0xb);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" {",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  label = \"0x",0xd);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(this->m_functionName)._M_dataplus._M_p,
                      (this->m_functionName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\"",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  labelloc = \"t\"",0x10)
  ;
  cVar4 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"  node[shape=record]",0x14);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  local_200 = __return_storage_ptr__;
  nodes_abi_cxx11_((list<CfgNode_*,_std::allocator<CfgNode_*>_> *)&local_1d0,this);
  if (local_1d0._M_next != &local_1d0) {
    local_254 = 1;
    p_Var7 = local_1d0._M_next;
    do {
      node = (CfgNode *)p_Var7[1]._M_next;
      local_1f8 = p_Var7;
      switch(node->m_type) {
      case CFG_ENTRY:
        lVar9 = 0x51;
        pcVar10 = 
        "  Entry [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled]";
        break;
      case CFG_BLOCK:
        pDVar2 = node->m_data;
        if (pDVar2 == (Data *)0x0) {
          __assert_fail("node->data() != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFG.cpp"
                        ,0x11c,"std::string CFG::toDOT() const");
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  \"0x",5);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" [label=\"{",0xb);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    0x",6);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
        *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar6 = (ostream *)
                 std::ostream::operator<<((ostream *)poVar6,*(int *)&pDVar2[1]._vptr_Data);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]\\l",3);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"    | [instrs]\\l",0x10);
        std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
        std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::list
                  ((list<Instruction_*,_std::allocator<Instruction_*>_> *)&local_218,
                   (list<Instruction_*,_std::allocator<Instruction_*>_> *)&pDVar2[1].m_addr);
        p_Var7 = local_218._M_next;
        if (local_218._M_next != &local_218) {
          do {
            p_Var3 = p_Var7[1]._M_next;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"    &nbsp;&nbsp;0x",0x12);
            *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                 *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," \\<+",4);
            *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
                 *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
            poVar6 = (ostream *)
                     std::ostream::operator<<((ostream *)poVar6,*(int *)&p_Var3[1]._M_next);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\\>: ",4);
            dotFilter((string *)&local_248,(string *)&p_Var3[1]._M_prev);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,(char *)local_248._M_impl._0_8_,
                                local_248._M_impl.super__Rb_tree_header._M_header._0_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\\l",2);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
            if ((_Base_ptr *)local_248._M_impl._0_8_ !=
                &local_248._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)local_248._M_impl._0_8_);
            }
            p_Var7 = p_Var7->_M_next;
          } while (p_Var7 != &local_218);
        }
        std::_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>
        ::_Rb_tree((_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>
                    *)&local_248,
                   (_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>
                    *)(pDVar2 + 3));
        if (local_248._M_impl.super__Rb_tree_header._M_node_count != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"     | [calls]\\l",0x10);
          std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar4);
          std::ostream::put(cVar4);
          std::ostream::flush();
          *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
               *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
          for (p_Var8 = local_248._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var8 != &local_248._M_impl.super__Rb_tree_header;
              p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
            lVar9 = *(long *)(p_Var8 + 1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"     &nbsp;&nbsp;0x",0x13);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
            dotFilter(&local_1f0,(string *)(lVar9 + 0x18));
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\\l",3);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p);
            }
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  }\"]",5);
        std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
        if (*(char *)((long)&pDVar2[1]._vptr_Data + 4) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  \"Unknown",10);
          *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
               *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 2;
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,local_254);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"\" [label=\"?\", shape=none]",0x19);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  \"0x",5);
          *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
               *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" -> \"Unknown",0xd);
          *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
               *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,local_254);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" [style=dashed]",0x10);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          local_254 = local_254 + 1;
        }
        *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
        std::_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>
        ::~_Rb_tree((_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>
                     *)&local_248);
        p_Var7 = local_218._M_next;
        while (p_Var7 != &local_218) {
          p_Var3 = (((_List_base<Instruction_*,_std::allocator<Instruction_*>_> *)&p_Var7->_M_next)
                   ->_M_impl)._M_node.super__List_node_base._M_next;
          operator_delete(p_Var7);
          p_Var7 = p_Var3;
        }
        goto LAB_00105397;
      case CFG_PHANTOM:
        if (node->m_data == (Data *)0x0) {
          __assert_fail("node->data() != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFG.cpp"
                        ,0x145,"std::string CFG::toDOT() const");
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  \"0x",5);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" [label=\"{",0xb);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"     0x",7);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\\l",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"  }\", style=dashed]",0x13);
        std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
        goto LAB_00105397;
      case CFG_EXIT:
        lVar9 = 0x5e;
        pcVar10 = 
        "  Exit [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled,peripheries=2]"
        ;
        break;
      case CFG_HALT:
        lVar9 = 0x5e;
        pcVar10 = 
        "  Halt [label=\"\",width=0.3,height=0.3,shape=square,fillcolor=black,style=filled,peripheries=2]"
        ;
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFG.cpp"
                      ,0x14f,"std::string CFG::toDOT() const");
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,lVar9);
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
LAB_00105397:
      std::
      _Rb_tree<CfgNode::Edge,_CfgNode::Edge,_std::_Identity<CfgNode::Edge>,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_>
      ::_Rb_tree(&local_248,&(node->m_succs)._M_t);
      for (p_Var8 = local_248._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &local_248._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        if (node->m_type - CFG_BLOCK < 2) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  \"0x",5);
          CfgNode::node2addr(node);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          lVar9 = 5;
          pcVar10 = "\" -> ";
        }
        else {
          lVar9 = 0xb;
          pcVar10 = "  Entry -> ";
          poVar6 = (ostream *)local_1a8;
          if (node->m_type != CFG_ENTRY) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFG.cpp"
                          ,0x15e,"std::string CFG::toDOT() const");
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar10,lVar9);
        node_00 = (CfgNode *)p_Var8[1]._M_parent;
        TVar1 = node_00->m_type;
        if (TVar1 - CFG_BLOCK < 2) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"0x",3);
          CfgNode::node2addr(node_00);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          lVar9 = 1;
          pcVar10 = "\"";
        }
        else {
          lVar9 = 4;
          poVar6 = (ostream *)local_1a8;
          if (TVar1 == CFG_EXIT) {
            pcVar10 = "Exit";
          }
          else {
            if (TVar1 != CFG_HALT) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFG.cpp"
                            ,0x16f,"std::string CFG::toDOT() const");
            }
            pcVar10 = "Halt";
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar10,lVar9);
        std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
      }
      std::
      _Rb_tree<CfgNode::Edge,_CfgNode::Edge,_std::_Identity<CfgNode::Edge>,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_>
      ::~_Rb_tree(&local_248);
      p_Var7 = local_1f8->_M_next;
    } while (p_Var7 != &local_1d0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
  psVar5 = local_200;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  while (local_1d0._M_next != &local_1d0) {
    p_Var7 = (((_List_base<CfgNode_*,_std::allocator<CfgNode_*>_> *)&(local_1d0._M_next)->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(local_1d0._M_next);
    local_1d0._M_next = p_Var7;
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar5;
}

Assistant:

std::string CFG::toDOT() const {
	std::stringstream ss;
	int unknown = 1;

	ss << std::hex;
	ss << "digraph \"0x" << m_addr << "\" {" << std::endl;
	ss << "  label = \"0x" << m_addr << " (" << m_functionName << ")\"" << std::endl;
    ss << "  labelloc = \"t\"" << std::endl;
    ss << "  node[shape=record]" << std::endl;
    ss << std::endl;

	std::list<CfgNode*> nodes = this->nodes();
	for (std::list<CfgNode*>::const_iterator it = nodes.cbegin(),
			ed = nodes.cend(); it != ed; it++) {
		CfgNode* node = *it;
		switch (node->type()) {
			case CfgNode::CFG_ENTRY:
			    ss << "  Entry [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled]" << std::endl;
			    break;
			case CfgNode::CFG_EXIT:
				ss << "  Exit [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled,peripheries=2]" << std::endl;
			    break;
			case CfgNode::CFG_HALT:
				ss << "  Halt [label=\"\",width=0.3,height=0.3,shape=square,fillcolor=black,style=filled,peripheries=2]" << std::endl;
			    break;
			case CfgNode::CFG_BLOCK: {
				assert(node->data() != 0);
				CfgNode::BlockData* blockData = static_cast<CfgNode::BlockData*>(node->data());

				Addr addr =  blockData->addr();
				ss << "  \"0x" << addr << "\" [label=\"{" << std::endl;
				ss << "    0x" << addr << " [" << std::dec << blockData->size() << "]\\l" << std::endl;
				ss << "    | [instrs]\\l" << std::endl;

				std::list<Instruction*> instrs = blockData->instructions();
				for (std::list<Instruction*>::const_iterator it = instrs.cbegin(), ed = instrs.cend();
						it != ed; it++) {
					Instruction* instr = *it;
					ss << "    &nbsp;&nbsp;0x" << std::hex << instr->addr() << " \\<+"
							<< std::dec << instr->size() << "\\>: " << dotFilter(instr->text())
							<< "\\l" << std::endl;
				}

				std::set<CFG*> calls = blockData->calls();
				if (!calls.empty()) {
					ss << "     | [calls]\\l" << std::endl;
					ss << std::hex;
					for (std::set<CFG*>::const_iterator it = calls.cbegin(), ed = calls.cend();
							it != ed; it++) {
						CFG* called = *it;
						ss << "     &nbsp;&nbsp;0x" << called->addr() << " ("
							<< dotFilter(called->functionName()) << ")\\l" << std::endl;
					}
				}

				ss << "  }\"]" << std::endl;

                if (blockData->isIndirect()) {
                		ss << "  \"Unknown" << std::dec << unknown << "\" [label=\"?\", shape=none]" << std::endl;
                		ss << "  \"0x" << std::hex << blockData->addr() << "\" -> \"Unknown" << std::dec << unknown << "\" [style=dashed]" << std::endl;
                    unknown++;
                }

				ss << std::hex;
				break;
			}
			case CfgNode::CFG_PHANTOM: {
				assert(node->data() != 0);
				CfgNode::PhantomData* phantomData = static_cast<CfgNode::PhantomData*>(node->data());

				ss << "  \"0x" << phantomData->addr() << "\" [label=\"{" << std::endl;
				ss << "     0x" << phantomData->addr() << "\\l" << std::endl;
				ss << "  }\", style=dashed]" << std::endl;

				break;
			}
			default:
				assert(false);
		}

		std::set<CfgNode::Edge> succs = node->successors();
		for (std::set<CfgNode::Edge>::iterator it = succs.begin(), ed = succs.end();
				it != ed; it++) {
			switch (node->type()) {
				case CfgNode::CFG_ENTRY:
					ss << "  Entry -> ";
					break;
				case CfgNode::CFG_BLOCK:
				case CfgNode::CFG_PHANTOM:
					ss << "  \"0x" << CfgNode::node2addr(node) << "\" -> ";
					break;
				default:
					assert(false);
			}

			CfgNode* succ = it->node;
			switch (succ->type()) {
				case CfgNode::CFG_EXIT:
					ss << "Exit";
					break;
				case CfgNode::CFG_HALT:
					ss << "Halt";
					break;
				case CfgNode::CFG_BLOCK:
				case CfgNode::CFG_PHANTOM:
					ss << "\"0x" << CfgNode::node2addr(succ) << "\"";
					break;
				case CfgNode::CFG_ENTRY:
				default:
					assert(false);
			}

			ss << std::endl;
		}
	}
	ss << "}" << std::endl;

	return ss.str();
}